

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void map_hash_resize(JSContext *ctx,JSMapState *s)

{
  JSValue key;
  uint uVar1;
  uint32_t uVar2;
  JSContext *ctx_00;
  list_head *el_00;
  void *in_RSI;
  JSContext *in_RDI;
  JSMapRecord *mr;
  list_head *el;
  list_head *new_hash_table;
  size_t slack;
  uint32_t h;
  uint32_t i;
  uint32_t new_hash_size;
  list_head *in_stack_ffffffffffffffb8;
  long local_38;
  ulong in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  int iVar4;
  
  if (*(int *)((long)in_RSI + 0x28) == 1) {
    iVar4 = 4;
  }
  else {
    iVar4 = *(int *)((long)in_RSI + 0x28) << 1;
  }
  ctx_00 = (JSContext *)
           js_realloc2(in_RDI,in_RSI,CONCAT44(iVar4,in_stack_ffffffffffffffe8),
                       (size_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (ctx_00 != (JSContext *)0x0) {
    uVar1 = iVar4 + (int)(in_stack_ffffffffffffffd8 >> 4);
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      init_list_head((list_head *)(&(ctx_00->header).ref_count + (ulong)uVar3 * 4));
    }
    for (local_38 = *(long *)((long)in_RSI + 0x10); local_38 != (long)in_RSI + 8;
        local_38 = *(long *)(local_38 + 8)) {
      el_00 = (list_head *)(local_38 + -0x18);
      if (*(int *)(local_38 + -0x14) == 0) {
        key.tag._0_4_ = in_stack_ffffffffffffffe0;
        key.u.ptr = (void *)in_stack_ffffffffffffffd8;
        key.tag._4_4_ = in_stack_ffffffffffffffe4;
        uVar2 = map_hash_key(ctx_00,key);
        in_stack_ffffffffffffffe4 = uVar2 & uVar1 - 1;
        list_add_tail(el_00,in_stack_ffffffffffffffb8);
      }
    }
    *(JSContext **)((long)in_RSI + 0x20) = ctx_00;
    *(uint *)((long)in_RSI + 0x28) = uVar1;
    *(uint *)((long)in_RSI + 0x2c) = uVar1 << 1;
  }
  return;
}

Assistant:

static void map_hash_resize(JSContext *ctx, JSMapState *s)
{
    uint32_t new_hash_size, i, h;
    size_t slack;
    struct list_head *new_hash_table, *el;
    JSMapRecord *mr;

    /* XXX: no reporting of memory allocation failure */
    if (s->hash_size == 1)
        new_hash_size = 4;
    else
        new_hash_size = s->hash_size * 2;
    new_hash_table = js_realloc2(ctx, s->hash_table,
                                 sizeof(new_hash_table[0]) * new_hash_size, &slack);
    if (!new_hash_table)
        return;
    new_hash_size += slack / sizeof(*new_hash_table);

    for(i = 0; i < new_hash_size; i++)
        init_list_head(&new_hash_table[i]);

    list_for_each(el, &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty) {
            h = map_hash_key(ctx, mr->key) & (new_hash_size - 1);
            list_add_tail(&mr->hash_link, &new_hash_table[h]);
        }
    }
    s->hash_table = new_hash_table;
    s->hash_size = new_hash_size;
    s->record_count_threshold = new_hash_size * 2;
}